

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_add.c
# Opt level: O0

bool_t zzIsSumEq_fast(word *c,word *a,word *b,size_t n)

{
  ulong uVar1;
  size_t i;
  word w;
  word carry;
  size_t n_local;
  word *b_local;
  word *a_local;
  word *c_local;
  
  carry = 0;
  i = 0;
  do {
    if (n <= i) {
      return (uint)(carry == 0);
    }
    uVar1 = a[i] + carry;
    if (uVar1 < carry) {
      if (c[i] != b[i]) {
        return 0;
      }
    }
    else {
      if (c[i] != uVar1 + b[i]) {
        return 0;
      }
      carry = (word)(int)(uint)(c[i] < uVar1);
    }
    i = i + 1;
  } while( true );
}

Assistant:

bool_t FAST(zzIsSumEq)(const word c[], const word a[], const word b[], 
	size_t n)
{
	register word carry = 0;
	register word w;
	size_t i;
	ASSERT(wwIsValid(a, n));
	ASSERT(wwIsValid(b, n));
	ASSERT(wwIsValid(c, n));
	for (i = 0; i < n; ++i)
	{
		w = a[i] + carry;
		if (w < carry)
			if (c[i] != b[i])
				return FALSE;
			else
				continue;
		if (c[i] != (word)(w + b[i]))
			return FALSE;
		carry = c[i] < w;
	}
	w = 0;
	return carry == 0;
}